

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_adapt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *adaptor_secret32,
              uchar *adaptor_sig65)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int overflow;
  secp256k1_scalar sigr;
  secp256k1_scalar local_80;
  secp256k1_scalar local_60;
  secp256k1_scalar local_40;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "sig != NULL";
  }
  else if (adaptor_secret32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_secret32 != NULL";
  }
  else {
    if (adaptor_sig65 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_60,adaptor_secret32,&overflow);
      if (overflow != 0) {
        return 0;
      }
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        ((secp256k1_ge *)0x0,&sigr,&local_80,adaptor_sig65);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_inverse(&local_40,&local_60);
      secp256k1_scalar_mul(&local_40,&local_40,&local_80);
      iVar1 = secp256k1_scalar_is_high(&local_40);
      secp256k1_scalar_cond_negate(&local_40,iVar1);
      *(uint64_t *)sig->data = sigr.d[0];
      *(uint64_t *)(sig->data + 8) = sigr.d[1];
      *(uint64_t *)(sig->data + 0x10) = sigr.d[2];
      *(uint64_t *)(sig->data + 0x18) = sigr.d[3];
      *(uint64_t *)(sig->data + 0x20) = local_40.d[0];
      *(uint64_t *)(sig->data + 0x28) = local_40.d[1];
      *(uint64_t *)(sig->data + 0x30) = local_40.d[2];
      *(uint64_t *)(sig->data + 0x38) = local_40.d[3];
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "adaptor_sig65 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_adapt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_secret32, const unsigned char *adaptor_sig65) {
    secp256k1_scalar adaptor_secret;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    unsigned char buf32[32];
    int high;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_secret32 != NULL);
    ARG_CHECK(adaptor_sig65 != NULL);

    secp256k1_scalar_set_b32(&adaptor_secret, adaptor_secret32, &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, &sp, adaptor_sig65)) {
        secp256k1_scalar_clear(&adaptor_secret);
        return 0;
    }
    secp256k1_scalar_inverse(&s, &adaptor_secret);
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);

    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    memset(buf32, 0, sizeof(buf32));
    secp256k1_scalar_clear(&adaptor_secret);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return 1;
}